

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3 *psVar1;
  sqlite3_module *psVar2;
  int iVar3;
  Table *pTVar4;
  Module *pMod;
  char *pcVar5;
  PragmaName *pAux;
  char *pcVar6;
  char *local_38;
  
  psVar1 = pParse->db;
  if (((psVar1->mDbFlags & 8) != 0) || (iVar3 = sqlite3ReadSchema(pParse), iVar3 == 0)) {
    pTVar4 = sqlite3FindTable(psVar1,zName,zDbase);
    if (pTVar4 != (Table *)0x0) {
      return pTVar4;
    }
    pcVar6 = "no such view";
    if ((flags & 1) == 0) {
      pcVar6 = "no such table";
    }
    pMod = (Module *)sqlite3HashFind(&psVar1->aModule,zName);
    if ((pMod != (Module *)0x0) ||
       ((((iVar3 = sqlite3_strnicmp(zName,"pragma_",7), iVar3 == 0 &&
          (pAux = pragmaLocate(zName + 7), pAux != (PragmaName *)0x0)) &&
         ((pAux->mPragFlg & 0x30) != 0)) &&
        (pMod = sqlite3VtabCreateModule
                          (psVar1,zName,&pragmaVtabModule,pAux,(_func_void_void_ptr *)0x0),
        pMod != (Module *)0x0)))) {
      psVar2 = pMod->pModule;
      local_38 = (char *)0x0;
      if (pMod->pEpoTab != (Table *)0x0) {
        return pMod->pEpoTab;
      }
      psVar1 = pParse->db;
      if (((psVar2->xCreate ==
            (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)0x0
           ) || (psVar2->xCreate == psVar2->xConnect)) &&
         (pTVar4 = (Table *)sqlite3DbMallocZero(psVar1,0x80), pTVar4 != (Table *)0x0)) {
        pcVar5 = sqlite3DbStrDup(psVar1,pMod->zName);
        pTVar4->zName = pcVar5;
        if (pcVar5 == (char *)0x0) {
          sqlite3DbFreeNN(psVar1,pTVar4);
        }
        else {
          pMod->pEpoTab = pTVar4;
          pTVar4->nTabRef = 1;
          pTVar4->pSchema = psVar1->aDb->pSchema;
          pTVar4->iPKey = -1;
          pcVar5 = sqlite3DbStrDup(psVar1,pcVar5);
          addModuleArgument(psVar1,pTVar4,pcVar5);
          addModuleArgument(psVar1,pTVar4,(char *)0x0);
          pcVar5 = sqlite3DbStrDup(psVar1,pTVar4->zName);
          addModuleArgument(psVar1,pTVar4,pcVar5);
          iVar3 = vtabCallConstructor(psVar1,pTVar4,pMod,psVar2->xConnect,&local_38);
          pcVar5 = local_38;
          if (iVar3 == 0) {
            return pMod->pEpoTab;
          }
          sqlite3ErrorMsg(pParse,"%s");
          sqlite3DbFree(psVar1,pcVar5);
          sqlite3VtabEponymousTableClear(psVar1,pMod);
        }
      }
    }
    if ((flags & 2) == 0) {
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar6,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar6,zDbase,zName);
      }
      pParse->checkSchema = '\x01';
    }
  }
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0 
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
    if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
      pMod = sqlite3PragmaVtabRegister(db, zName);
    }
    if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
      return pMod->pEpoTab;
    }
#endif
    if( (flags & LOCATE_NOERR)==0 ){
      if( zDbase ){
        sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
      }else{
        sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
      }
      pParse->checkSchema = 1;
    }
  }

  return p;
}